

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

size_t __thiscall
andres::
BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
::dimension(BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
            *this)

{
  ulong uVar1;
  ulong uVar2;
  runtime_error *this_00;
  
  if (this->e1_->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    if (this->e2_->data_ != (pointer)0x0) {
      uVar1 = (this->e1_->geometry_).dimension_;
      uVar2 = (this->e2_->geometry_).dimension_;
      if (uVar2 < uVar1) {
        uVar2 = uVar1;
      }
      return uVar2;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::size_t dimension() const 
        { return e1_.dimension() < e2_.dimension() ? e2_.dimension() : e1_.dimension(); }